

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseElemModuleField(WastParser *this,Module *module)

{
  long *plVar1;
  Result RVar2;
  TokenType TVar3;
  Enum EVar4;
  Token local_108;
  Var local_b8;
  undefined1 local_70 [8];
  Location loc;
  string name;
  long *local_28;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation((Location *)local_70,this);
  RVar2 = Expect(this,Elem);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  loc.field_1._8_8_ = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  ParseBindVarOpt(this,(string *)((long)&loc.field_1 + 8));
  MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&,std::__cxx11::string&>
            ((wabt *)&local_28,(Location *)local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&loc.field_1 + 8));
  TVar3 = Peek(this,0);
  plVar1 = local_28;
  if (TVar3 == Passive) {
    Consume(&local_108,this);
    Token::~Token(&local_108);
    *(undefined1 *)(local_28 + 0x15) = 1;
LAB_00da6d15:
    ParseVarListOpt(this,(VarVector *)(local_28 + 0x19));
    RVar2 = Expect(this,Rpar);
    if (RVar2.enum_ != Error) {
      name.field_2._8_8_ = local_28;
      local_28 = (long *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                  *)((long)&name.field_2 + 8));
      if (name.field_2._8_8_ != 0) {
        (**(code **)(*(long *)name.field_2._8_8_ + 8))();
      }
      name.field_2._8_8_ = 0;
      EVar4 = Ok;
      goto LAB_00da6d67;
    }
  }
  else {
    Var::Var(&local_b8,0,(Location *)local_70);
    ParseVarOpt(this,(Var *)(plVar1 + 0xc),&local_b8);
    Var::~Var(&local_b8);
    RVar2 = ParseOffsetExpr(this,(ExprList *)(local_28 + 0x16));
    if (RVar2.enum_ != Error) goto LAB_00da6d15;
  }
  EVar4 = Error;
LAB_00da6d67:
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  std::__cxx11::string::~string((string *)(loc.field_1.field2 + 8));
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseElemModuleField(Module* module) {
  WABT_TRACE(ParseElemModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Elem);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = MakeUnique<ElemSegmentModuleField>(loc, name);

  if (Peek() == TokenType::Passive) {
    Consume();
    field->elem_segment.passive = true;
  } else {
    ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    CHECK_RESULT(ParseOffsetExpr(&field->elem_segment.offset));
  }
  ParseVarListOpt(&field->elem_segment.vars);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}